

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_short_to_int_inplace(short *shortarray,long length,int shift,int *status)

{
  void *__ptr;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long nmax;
  long firstelem;
  long ntodo;
  long ii;
  int *aliasarray;
  int *intarray;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_4;
  
  if (*in_RCX < 1) {
    local_48 = 10000;
    if (in_RSI < 10000) {
      local_48 = in_RSI;
    }
    local_50 = in_RSI - local_48;
    __ptr = malloc(local_48 << 2);
    if (__ptr == (void *)0x0) {
      ffpmsg((char *)0x2068cd);
      *in_RCX = 0x71;
      local_4 = 0x71;
    }
    else {
      while (0 < local_48) {
        for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
          *(int *)((long)__ptr + local_40 * 4) =
               *(short *)(in_RDI + (local_40 + local_50) * 2) + in_EDX;
        }
        memcpy((void *)(in_RDI + local_50 * 4),__ptr,local_48 << 2);
        if (local_50 == 0) {
          local_48 = 0;
        }
        else if (local_50 < 0x2711) {
          local_48 = local_50;
          local_50 = 0;
        }
        else {
          local_50 = local_50 + -10000;
        }
      }
      free(__ptr);
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

static int fits_short_to_int_inplace(short *shortarray, long length, int shift, int *status)

/* convert the input array of 16-bit integers into an array of 32-bit integers,
in place. This will overwrite the input array with the new longer array starting
at the same memory location.  

Note that aliasing the same memory location with pointers of different datatypes is
not allowed in strict ANSI C99, however it is  used here for efficency. In principle,
one could simply copy the input array in reverse order to the output array,
but this only works if the compiler performs the operation in strict order.  Certain
compiler optimization techniques may vioate this assumption.  Therefore, we first
copy a section of the input array to a temporary intermediate array, before copying
the longer datatype values back to the original array.
*/

{
    int *intarray, *aliasarray;
    long ii, ntodo, firstelem, nmax = 10000;
    
    if (*status > 0) 
        return(*status);

    ntodo = nmax;
    if (length < nmax) ntodo = length;
    
    firstelem = length - ntodo;  /* first element to be converted */
    
    intarray = (int *) malloc(ntodo * sizeof(int));
    
    if (intarray == NULL)
    {
	ffpmsg("Out of memory. (fits_short_to_int_inplace)");
	return (*status = MEMORY_ALLOCATION);
    }

    aliasarray = (int *) shortarray; /* alias pointer to the input array */

    while (ntodo > 0) {
    
	/* do datatype conversion into temp array */
        for (ii = 0; ii < ntodo; ii++) { 
	    intarray[ii] = (int)(shortarray[ii + firstelem]) + shift;
        }

        /* copy temp array back to alias */
        memcpy(&(aliasarray[firstelem]), intarray, ntodo * 4);
	
        if (firstelem == 0) {  /* we are all done */
	    ntodo = 0;   
	} else {  /* recalculate ntodo and firstelem for next loop */
	    if (firstelem > nmax) {
	        firstelem -= nmax;
	    } else {
	        ntodo = firstelem;
	        firstelem = 0;
	    }
	}
    }

    free(intarray);
    return(*status);
}